

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

bool kratos::check_stmt_condition
               (Stmt *stmt,function<bool_(kratos::Stmt_*)> *cond,bool check_unreachable,
               bool full_branch)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  _Base_ptr p_Var7;
  long lVar8;
  StmtException *this;
  undefined8 *puVar9;
  InternalException *pIVar10;
  _Base_ptr p_Var11;
  undefined7 in_register_00000011;
  int iVar12;
  Stmt *pSVar13;
  undefined4 uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  const_iterator local_c0;
  const_iterator local_b8;
  ulong local_b0;
  undefined1 auStack_a8 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmts;
  undefined1 local_70 [8];
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  cases;
  
  local_70 = (undefined1  [8])stmt;
  if ((cond->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar3 = (*cond->_M_invoker)((_Any_data *)cond,(Stmt **)local_70);
  if (bVar3) {
    return true;
  }
  bVar3 = false;
  uVar14 = (undefined4)CONCAT71(in_register_00000011,check_unreachable);
  cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = uVar14;
  switch(stmt->type_) {
  case If:
    lVar8 = __dynamic_cast(stmt,&Stmt::typeinfo,&IfStmt::typeinfo);
    if (lVar8 == 0) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_70 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Statement is not if but is marked as StatementType::If","");
      InternalException::InternalException(pIVar10,(string *)local_70);
      __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (full_branch) {
      bVar3 = check_stmt_condition(*(Stmt **)(lVar8 + 0xe0),cond,check_unreachable,true);
      if (!bVar3) goto LAB_0021672b;
      pSVar13 = *(Stmt **)(lVar8 + 0xf0);
      bVar3 = true;
    }
    else {
      bVar3 = check_stmt_condition(*(Stmt **)(lVar8 + 0xe0),cond,check_unreachable,false);
      if (bVar3) {
        return true;
      }
      pSVar13 = *(Stmt **)(lVar8 + 0xf0);
      bVar3 = false;
    }
    bVar3 = check_stmt_condition(pSVar13,cond,check_unreachable,bVar3);
    break;
  case Switch:
    lVar8 = __dynamic_cast(stmt,&Stmt::typeinfo,&SwitchStmt::typeinfo,0);
    if (lVar8 == 0) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_70 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Statement is not switch but is marked as StatementType::Switch"
                 ,"");
      InternalException::InternalException(pIVar10,(string *)local_70);
      __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
    ::_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)local_70,
               (_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)(lVar8 + 0xe0));
    bVar3 = false;
    iVar12 = 0;
    if (cases._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
      if (cases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&cases) {
        iVar12 = 0;
        bVar3 = SUB41(cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,0);
        p_Var7 = cases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          bVar4 = check_stmt_condition((Stmt *)p_Var7[1]._M_left,cond,bVar3,full_branch);
          if (!bVar4 && full_branch) {
            bVar3 = false;
            goto LAB_00216a01;
          }
          iVar12 = iVar12 + (uint)bVar4;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)&cases);
      }
      plVar1 = *(long **)(lVar8 + 0xc0);
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 200);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      cVar5 = (**(code **)(*plVar1 + 0xd0))();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      plVar1 = *(long **)(lVar8 + 0xc0);
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 200);
      if (cVar5 == '\0') {
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        bVar6 = (**(code **)(*plVar1 + 0x38))();
        iVar15 = 1 << (bVar6 & 0x1f);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      else {
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        if (plVar1 == (long *)0x0) {
          puVar9 = (undefined8 *)0x0;
        }
        else {
          puVar9 = (undefined8 *)
                   __dynamic_cast(plVar1,&Var::typeinfo,&EnumType::typeinfo,0xfffffffffffffffe);
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if (puVar9 == (undefined8 *)0x0) {
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          auStack_a8 = (undefined1  [8])
                       &stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"Unable to resolve enum type","");
          InternalException::InternalException(pIVar10,(string *)auStack_a8);
          __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar8 = (**(code **)*puVar9)(puVar9);
        iVar15 = *(int *)(lVar8 + 0x38);
      }
      if (full_branch) {
        p_Var7 = (_Base_ptr)&cases;
        if (cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
          do {
            p_Var11 = (_Base_ptr)cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
            cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var11->_M_left;
          } while (p_Var11->_M_left != (_Base_ptr)0x0);
          if ((p_Var11 != (_Base_ptr)&cases) && (p_Var7 = p_Var11, *(long *)(p_Var11 + 1) != 0)) {
            p_Var7 = (_Base_ptr)&cases;
          }
        }
        bVar3 = iVar12 == iVar15 || p_Var7 != (_Base_ptr)&cases;
      }
      else {
        bVar3 = iVar12 != 0;
      }
    }
LAB_00216a01:
    std::
    _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)local_70);
    break;
  case For:
    lVar8 = __dynamic_cast(stmt,&Stmt::typeinfo,&ForStmt::typeinfo,0);
    if (lVar8 == 0) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_70 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Statement is not if but is marked as StatementType::For","");
      InternalException::InternalException(pIVar10,(string *)local_70);
      __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    pSVar13 = *(Stmt **)(lVar8 + 0xe8);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0xf0);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    bVar3 = check_stmt_condition(pSVar13,cond,check_unreachable,full_branch);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    break;
  case Block:
    lVar8 = __dynamic_cast(stmt,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
    if (lVar8 == 0) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_70 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Statement is not block but is marked as StatementType::Block",
                 "");
      InternalException::InternalException(pIVar10,(string *)local_70);
      __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar19 = *(long *)(lVar8 + 200) - *(long *)(lVar8 + 0xc0);
    if (lVar19 != 0) {
      uVar20 = lVar19 >> 4;
      local_b0 = uVar20 + (uVar20 == 0);
      bVar3 = true;
      lVar19 = 8;
      uVar16 = 0;
      do {
        pSVar13 = *(Stmt **)(*(long *)(lVar8 + 0xc0) + -8 + lVar19);
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (*(long *)(lVar8 + 0xc0) + lVar19);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        bVar4 = check_stmt_condition(pSVar13,cond,check_unreachable,full_branch);
        uVar17 = uVar16;
        if (bVar4) break;
        uVar16 = uVar16 + 1;
        bVar3 = uVar16 < uVar20;
        lVar19 = lVar19 + 0x10;
        uVar17 = local_b0;
      } while (local_b0 != uVar16);
      if (((byte)cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ & bVar3) != 1) {
        return bVar3;
      }
      lVar19 = *(long *)(lVar8 + 0xc0);
      uVar16 = *(long *)(lVar8 + 200) - lVar19 >> 4;
      if (uVar17 == uVar16 - 1) {
        return true;
      }
      auStack_a8 = (undefined1  [8])0x0;
      stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar20 = uVar17 + 1;
      if (uVar20 < uVar16) {
        lVar18 = uVar17 * 0x10 + 0x18;
        do {
          local_70 = *(undefined1 (*) [8])(lVar19 + -8 + lVar18);
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar19 + lVar18);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                    ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_a8,
                     (Stmt **)local_70);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          uVar20 = uVar20 + 1;
          lVar19 = *(long *)(lVar8 + 0xc0);
          lVar18 = lVar18 + 0x10;
        } while (uVar20 < (ulong)(*(long *)(lVar8 + 200) - lVar19 >> 4));
      }
      this = (StmtException *)__cxa_allocate_exception(0x10);
      local_70 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Unreachable code block","");
      local_c0._M_current = (Stmt **)auStack_a8;
      local_b8._M_current =
           stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      StmtException::StmtException(this,(string *)local_70,&local_c0,&local_b8);
      __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_0021672b:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool check_stmt_condition(Stmt* stmt, const std::function<bool(Stmt*)>& cond,
                          bool check_unreachable = false, bool full_branch = true) {
    if (cond(stmt)) {
        return true;
    } else if (stmt->type() == StatementType::Block) {
        // it has to be the last block
        uint64_t index;
        bool found = false;
        auto* block = dynamic_cast<StmtBlock*>(stmt);
        if (!block)
            throw InternalException("Statement is not block but is marked as StatementType::Block");
        auto stmt_count = block->size();
        for (index = 0; index < stmt_count; index++) {
            auto* s = block->get_stmt(index).get();
            if (check_stmt_condition(s, cond, check_unreachable, full_branch)) {
                found = true;
                break;
            }
        }
        if (found && check_unreachable) {
            if (index != block->size() - 1) {
                // we have unreachable state
                std::vector<Stmt*> stmts;
                for (uint64_t i = index + 1; i < block->size(); i++)
                    stmts.emplace_back(block->get_stmt(i).get());
                throw StmtException("Unreachable code block", stmts.begin(), stmts.end());
            }
        }
        return found;
    } else if (stmt->type() == StatementType::Switch) {
        auto* stmt_ = dynamic_cast<SwitchStmt*>(stmt);
        if (!stmt_)
            throw InternalException(
                "Statement is not switch but is marked as StatementType::Switch");
        auto cases = stmt_->body();
        if (cases.empty()) return false;
        uint32_t found_case = 0;
        for (auto const& iter : cases) {
            auto* scope_stmt = iter.second.get();
            if (check_stmt_condition(scope_stmt, cond, check_unreachable, full_branch))
                found_case++;
            else if (full_branch)
                return false;
        }
        // make sure default case is covered
        // if there is no default case, all the cases have to be covered
        // the only exception is that if the target is an enum and we've covered all it's enum case
        uint32_t targeted_cases;
        if (stmt_->target()->is_enum()) {
            auto* enum_var = dynamic_cast<EnumType*>(stmt_->target().get());
            if (!enum_var) throw InternalException("Unable to resolve enum type");
            auto const* enum_def = enum_var->enum_type();
            targeted_cases = enum_def->values.size();
        } else {
            targeted_cases = 1u << stmt_->target()->width();
        }
        if (full_branch) {
            return cases.find(nullptr) != cases.end() || found_case == targeted_cases;
        } else {
            return found_case > 0;
        }
    } else if (stmt->type() == StatementType::If) {
        auto* stmt_ = dynamic_cast<IfStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::If");
        auto const& then = stmt_->then_body();
        auto const& else_ = stmt_->else_body();
        if (full_branch) {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) &&
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        } else {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) ||
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        }
    } else if (stmt->type() == StatementType::For) {
        auto* stmt_ = dynamic_cast<ForStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::For");
        auto body = stmt_->get_loop_body();
        return check_stmt_condition(body.get(), cond, check_unreachable, full_branch);
    }
    return false;
}